

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O3

void __thiscall TradeApi::on_order_trade(TradeApi *this,shared_ptr<tquant::api::Trade> *trade)

{
  TradeApiCallback *pTVar1;
  element_type *peVar2;
  Trade local_50;
  
  pTVar1 = this->cb;
  if (pTVar1 != (TradeApiCallback *)0x0) {
    peVar2 = (trade->super___shared_ptr<tquant::api::Trade,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_50.account_id = (peVar2->account_id)._M_dataplus._M_p;
    local_50.code = (peVar2->code)._M_dataplus._M_p;
    local_50.name = (peVar2->name)._M_dataplus._M_p;
    local_50.entrust_no = (peVar2->entrust_no)._M_dataplus._M_p;
    local_50.entrust_action = (peVar2->entrust_action)._M_dataplus._M_p;
    local_50.fill_no = (peVar2->fill_no)._M_dataplus._M_p;
    local_50.fill_size = peVar2->fill_size;
    local_50.fill_price = peVar2->fill_price;
    local_50.fill_date = peVar2->fill_date;
    local_50.fill_time = peVar2->fill_time;
    local_50.order_id = peVar2->order_id;
    (*pTVar1->on_trade)(&local_50,pTVar1->user_data);
  }
  return;
}

Assistant:

virtual void on_order_trade   (shared_ptr<tquant::api::Trade> trade) override {
        if (cb) {
            Trade c_trade;
            init_ctrade(&c_trade, trade.get());
            cb->on_trade(&c_trade, cb->user_data);
        }
    }